

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

vec3 polyscope::view::screenCoordsToWorldPosition(vec2 screenCoords)

{
  undefined8 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  vec3 vVar4;
  undefined4 uVar5;
  float fVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  col_type cVar15;
  vec4 worldPos;
  vec4 viewPos;
  vec4 clipPos;
  float z;
  vec2 screenPos;
  float inf;
  float depth;
  FrameBuffer *sceneFramebuffer;
  mat4 projInv;
  mat4 proj;
  mat4 viewInv;
  mat4 view;
  vec2 bufferCoords;
  vec<2,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe48;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 in_stack_fffffffffffffe84;
  vec<2,_float,_(glm::qualifier)0> local_154;
  vec<4,float,(glm::qualifier)0> local_14c [16];
  float local_13c;
  vec<2,_float,_(glm::qualifier)0> local_138;
  float local_130;
  float local_12c;
  element_type *local_128;
  undefined1 local_dc [4];
  row_type *in_stack_ffffffffffffff28;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_ffffffffffffff30;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_1c;
  float local_18;
  undefined8 local_14;
  vec<3,_float,_(glm::qualifier)0> local_c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar11 [56];
  undefined1 auVar14 [56];
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  local_14._0_4_ = (float)uVar1;
  fVar6 = (float)local_14 * (float)bufferWidth;
  local_14._4_4_ = (float)((ulong)uVar1 >> 0x20);
  fVar2 = local_14._4_4_ * (float)bufferHeight;
  local_14 = uVar1;
  glm::vec<2,_float,_(glm::qualifier)0>::vec
            ((vec<2,_float,_(glm::qualifier)0> *)&local_1c,fVar6 / (float)windowWidth,
             fVar2 / (float)windowHeight);
  getCameraViewMatrix();
  glm::inverse<4,4,float,(glm::qualifier)0>(in_stack_fffffffffffffe50);
  getCameraPerspectiveMatrix();
  uVar5 = (undefined4)((ulong)local_dc >> 0x20);
  glm::inverse<4,4,float,(glm::qualifier)0>(in_stack_fffffffffffffe50);
  local_128 = std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2> *
                         )(render::engine + 0xd0));
  fVar6 = (float)bufferHeight - local_18;
  (*local_128->_vptr_FrameBuffer[0xd])(local_128,CONCAT44(uVar5,(int)local_1c.x),(int)fVar6);
  local_12c = fVar6;
  if ((fVar6 != 1.0) || (NAN(fVar6))) {
    glm::vec<2,_float,_(glm::qualifier)0>::vec
              (&local_138,(float)local_14 / (float)windowWidth,
               1.0 - local_14._4_4_ / (float)windowHeight);
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)local_12c),
                             SUB6416(ZEXT464(0xbf800000),0));
    local_13c = auVar3._0_4_;
    auVar7._0_8_ = glm::operator*(in_stack_fffffffffffffe48,0.0);
    auVar7._8_56_ = extraout_var;
    vmovlpd_avx(auVar7._0_16_);
    auVar8._0_8_ = glm::operator-(in_stack_fffffffffffffe48,0.0);
    auVar8._8_56_ = extraout_var_00;
    auVar14 = (undefined1  [56])0x0;
    local_154 = (vec<2,_float,_(glm::qualifier)0>)vmovlpd_avx(auVar8._0_16_);
    auVar11 = (undefined1  [56])0x0;
    glm::vec<4,float,(glm::qualifier)0>::vec<float,float,float,(glm::qualifier)0>
              (local_14c,&local_154,local_13c,1.0);
    cVar15 = glm::operator*(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    auVar12._0_8_ = cVar15._8_8_;
    auVar12._8_56_ = auVar14;
    auVar9._0_8_ = cVar15._0_8_;
    auVar9._8_56_ = auVar11;
    vmovlpd_avx(auVar9._0_16_);
    vmovlpd_avx(auVar12._0_16_);
    auVar11 = (undefined1  [56])0x0;
    glm::vec<4,float,(glm::qualifier)0>::operator/=
              ((vec<4,_float,_(glm::qualifier)0> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c);
    cVar15 = glm::operator*(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    auVar13._0_8_ = cVar15._8_8_;
    auVar13._8_56_ = auVar14;
    auVar10._0_8_ = cVar15._0_8_;
    auVar10._8_56_ = auVar11;
    uVar1 = vmovlpd_avx(auVar10._0_16_);
    vmovlpd_avx(auVar13._0_16_);
    glm::vec<4,float,(glm::qualifier)0>::operator/=
              ((vec<4,_float,_(glm::qualifier)0> *)
               CONCAT44(SUB84(uVar1,0),in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c);
    glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,
               (vec<4,_float,_(glm::qualifier)0> *)&stack0xfffffffffffffe84);
  }
  else {
    local_130 = std::numeric_limits<float>::infinity();
    glm::vec<3,_float,_(glm::qualifier)0>::vec(&local_c,local_130,local_130,local_130);
  }
  vVar4.field_2 = local_c.field_2;
  vVar4.field_0 = local_c.field_0;
  vVar4.field_1 = local_c.field_1;
  return vVar4;
}

Assistant:

glm::vec3 screenCoordsToWorldPosition(glm::vec2 screenCoords) {

  glm::vec2 bufferCoords{screenCoords.x * static_cast<float>(view::bufferWidth) / static_cast<float>(view::windowWidth),
                         screenCoords.y * static_cast<float>(view::bufferHeight) /
                             static_cast<float>(view::windowHeight)};

  glm::mat4 view = getCameraViewMatrix();
  glm::mat4 viewInv = glm::inverse(view);
  glm::mat4 proj = getCameraPerspectiveMatrix();
  glm::mat4 projInv = glm::inverse(proj);
  // glm::vec2 depthRange = {0., 1.}; // no support for nonstandard depth range, currently

  // query the depth buffer to get depth
  render::FrameBuffer* sceneFramebuffer = render::engine->sceneBuffer.get();
  float depth = sceneFramebuffer->readDepth(bufferCoords.x, view::bufferHeight - bufferCoords.y);
  if (depth == 1.) {
    // if we didn't hit anything in the depth buffer, just return infinity
    float inf = std::numeric_limits<float>::infinity();
    return glm::vec3{inf, inf, inf};
  }

  // convert depth to world units
  glm::vec2 screenPos{screenCoords.x / static_cast<float>(view::windowWidth),
                      1.f - screenCoords.y / static_cast<float>(view::windowHeight)};
  float z = depth * 2.0f - 1.0f;
  glm::vec4 clipPos = glm::vec4(screenPos * 2.0f - 1.0f, z, 1.0f);
  glm::vec4 viewPos = projInv * clipPos;
  viewPos /= viewPos.w;

  glm::vec4 worldPos = viewInv * viewPos;
  worldPos /= worldPos.w;

  return glm::vec3(worldPos);
}